

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

reference * __thiscall
mjs::interpreter::impl::scope::lookup(reference *__return_storage_ptr__,scope *this,wstring *id)

{
  gc_heap_ptr_untyped gStack_38;
  wstring_view local_28;
  
  local_28._M_str = (id->_M_dataplus)._M_p;
  local_28._M_len = id->_M_string_length;
  string::string((string *)&gStack_38,this->heap_,&local_28);
  lookup(__return_storage_ptr__,this,(string *)&gStack_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_38);
  return __return_storage_ptr__;
}

Assistant:

reference lookup(const std::wstring& id) const {
            return lookup(string{heap_, id});
        }